

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O2

void __thiscall
TPZHCurlEquationFilter<double>::ChooseVertexAndEdge
          (TPZHCurlEquationFilter<double> *this,int64_t *treatVertex,int64_t *remEdge)

{
  map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  long *__k;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *this_01;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *this_02;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *p_Var8;
  const_iterator cVar9;
  ulong uVar10;
  long lVar11;
  const_iterator __position;
  map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
  *this_03;
  long ibase;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *__range1;
  int64_t ibase_free;
  int64_t base_node;
  long local_a8;
  key_type_conflict1 local_a0;
  uint local_94;
  _Base_ptr local_90;
  int64_t *local_88;
  long *local_80;
  _Rb_tree_node_base *local_78;
  map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
  *local_70;
  _Rb_tree_node_base *local_68;
  TPZHCurlEquationFilter<double> *local_60;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *local_58;
  _Rb_tree_node_base *local_50;
  _Rb_tree_node_base *local_48;
  long local_40;
  key_type_conflict1 local_38;
  
  local_58 = &this->freeEdgesToTreatedNodes;
  local_90 = (_Base_ptr)&this->field_0xa0;
  p_Var7 = *(_Base_ptr *)&this->field_0xb0;
  this_00 = &this->mVertex;
  this_03 = &this->mEdge;
  uVar10 = 0;
  local_88 = remEdge;
  local_80 = treatVertex;
  local_70 = this_03;
  local_60 = this;
  do {
    if ((p_Var7 == local_90) || ((uVar10 & 1) != 0)) {
      pmVar2 = std::
               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
               ::operator[](this_00,&local_38);
      __k = local_80;
      pmVar2->free_edges = pmVar2->free_edges + -1;
      pmVar2 = std::
               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
               ::operator[](this_00,local_80);
      pmVar2->free_edges = pmVar2->free_edges + -1;
      pmVar3 = std::
               map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
               ::operator[](this_03,local_88);
      this_01 = local_58;
      pmVar3->status = ERemovedEdge;
      this_02 = &std::
                 map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                 ::operator[](local_58,&local_40)->_M_t;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::erase
                (this_02,&local_38);
      local_a0 = local_40 + -1;
      p_Var8 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               std::
               map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
               ::operator[](this_01,&local_a0);
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>(p_Var8,&local_38);
      pmVar2 = std::
               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
               ::operator[](this_00,__k);
      p_Var8 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               std::
               map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
               ::operator[](this_01,&pmVar2->free_edges);
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>(p_Var8,__k);
      cVar9._M_node = *(_Base_ptr *)&local_60->field_0xb0;
      while (__position._M_node = cVar9._M_node, __position._M_node != local_90) {
        p_Var5 = __position._M_node[2]._M_left;
        cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        if (p_Var5 == (_Base_ptr)0x0) {
          std::
          _Rb_tree<long,std::pair<long_const,std::set<long,std::less<long>,std::allocator<long>>>,std::_Select1st<std::pair<long_const,std::set<long,std::less<long>,std::allocator<long>>>>,std::greater<int>,std::allocator<std::pair<long_const,std::set<long,std::less<long>,std::allocator<long>>>>>
          ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,std::set<long,std::less<long>,std::allocator<long>>>,std::_Select1st<std::pair<long_const,std::set<long,std::less<long>,std::allocator<long>>>>,std::greater<int>,std::allocator<std::pair<long_const,std::set<long,std::less<long>,std::allocator<long>>>>>
                              *)this_01,__position);
        }
      }
      return;
    }
    p_Var6 = *(_Rb_tree_node_base **)(p_Var7 + 2);
    local_50 = (_Rb_tree_node_base *)&p_Var7[1]._M_left;
    local_78 = p_Var7;
    while ((p_Var6 != local_50 &&
           (local_a0 = *(key_type_conflict1 *)(p_Var6 + 1), (uVar10 & 1) == 0))) {
      local_48 = p_Var6;
      pmVar2 = std::
               map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
               ::operator[](this_00,&local_a0);
      p_Var6 = &(pmVar2->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_68 = p_Var6;
      for (p_Var5 = (pmVar2->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var5 != p_Var6; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        lVar11 = (long)(int)p_Var5[1]._M_color;
        local_a8 = lVar11;
        pmVar3 = std::
                 map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                 ::operator[](this_03,&local_a8);
        if (pmVar3->status == EFreeEdge) {
          if ((uVar10 & 1) != 0) break;
          local_94 = (uint)uVar10;
          local_a8 = lVar11;
          pmVar3 = std::
                   map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                   ::operator[](this_03,&local_a8);
          for (p_Var4 = (pmVar3->vertex_connect)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var4 !=
              &(pmVar3->vertex_connect)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            _Var1 = p_Var4[1]._M_color;
            local_a8 = (long)(int)_Var1;
            pmVar2 = std::
                     map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                     ::operator[](this_00,&local_a8);
            if (pmVar2->status != ETreatedVertex) {
              local_38 = local_a0;
              *local_88 = lVar11;
              *local_80 = (long)(int)_Var1;
              local_40 = *(long *)(local_78 + 1);
              uVar10 = CONCAT71((int7)(int3)(_Var1 >> 8),1);
              p_Var6 = local_68;
              this_03 = local_70;
              goto LAB_010fb523;
            }
          }
          uVar10 = (ulong)local_94;
          p_Var6 = local_68;
          this_03 = local_70;
        }
LAB_010fb523:
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48);
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_78);
  } while( true );
}

Assistant:

void TPZHCurlEquationFilter<TVar>::ChooseVertexAndEdge(int64_t &treatVertex, int64_t &remEdge)
{
    
    // The treated node must be connected to an already treated node by a free edge
    // Thus, we take a treated node and then a free edge and its 
    // corresponding second node to be the treated one
    auto highest = freeEdgesToTreatedNodes.rbegin()->first; // highest number of free edges
    int64_t base_node;
    int64_t ibase_free;
    bool flag = false;
    // We look at all the treated nodes, starting from the one with the highest number of free edges
    for (const auto& free_edges : freeEdgesToTreatedNodes){
        if (flag) break;
        // We loop over each treated vertex with the maximum value of free edges (called basis node) 
        for (auto ibase : free_edges.second){       
            if (flag) break;
            // We loop over each edge connected to the basis node
            for (auto iedge : mVertex[ibase].edge_connect){
                if (mEdge[iedge].status != EFreeEdge) continue; // only free edges can be removed
                if (flag) break;
                // For each edge connected to the basis node, check if the complementary 
                // node has been treated before (to avoid choosing the same treatedNode more than once)
                for (auto inode : mEdge[iedge].vertex_connect){
                    if (mVertex[inode].status == ETreatedVertex) {
                        //The complementary node has been tretated, go to the next one
                        continue;
                    }
                    // The node was not treated before, then it is the chosen one.
                    // Thus fill the variables with the proper values
                    base_node = ibase;
                    remEdge = iedge;
                    treatVertex = inode;
                    ibase_free = free_edges.first;
                    
                    flag = true;
                    break;
                }
            }
        }
    }

    mVertex[base_node].free_edges--;
    mVertex[treatVertex].free_edges--;
    mEdge[remEdge].status = ERemovedEdge;
    
    //Update the data structure.
    //Delete node and realocate the base node
    freeEdgesToTreatedNodes[ibase_free].erase(base_node);
    freeEdgesToTreatedNodes[ibase_free-1].insert(base_node);
    //Insert treatVertex
    freeEdgesToTreatedNodes[mVertex[treatVertex].free_edges].insert(treatVertex);

    //Clears the freeEdgesToTreatedNodes with 0 nodes in some free edges - to avoid a bug when looping std::map
    for (auto it = freeEdgesToTreatedNodes.cbegin(); it != freeEdgesToTreatedNodes.cend();) {
        if (it->second.size() == 0) {
            freeEdgesToTreatedNodes.erase(it++);
        } else {
            ++it;
        }
    }//it
}